

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMeshSurface.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChMeshSurface::AddFacesFromNodeSet
          (ChMeshSurface *this,
          vector<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
          *node_set)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  pointer psVar4;
  pointer psVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  byte bVar7;
  long lVar8;
  _Hash_node_base *p_Var9;
  _Hash_node_base *p_Var10;
  int in;
  uint uVar11;
  ulong uVar12;
  shared_ptr<chrono::fea::ChElementTetrahedron> tet;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  node_set_map;
  new_allocator<chrono::fea::ChTetrahedronFace> local_e1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  shared_ptr<chrono::fea::ChElementHexahedron> local_d8;
  element_type *local_c8;
  _Hash_node_base *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  ChHexahedronFace *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  ChTetrahedronFace *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  ulong local_80;
  _func_int **local_78;
  _func_int **local_70;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  psVar4 = (node_set->
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((node_set->
      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != psVar4) {
    lVar8 = 0;
    uVar12 = 0;
    do {
      local_c0 = *(_Hash_node_base **)
                  ((long)&(psVar4->
                          super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr + lVar8);
      local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)&local_68;
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_68,&local_c0,&local_d8);
      psVar4 = (node_set->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar12 = uVar12 + 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar12 < (ulong)((long)(node_set->
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4)
            );
  }
  psVar5 = (this->mmesh->velements).
           super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->mmesh->velements).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5) >> 4) != 0) {
    uVar12 = 0;
    local_78 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2aa68;
    local_70 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2aa18;
    do {
      local_c8 = psVar5[uVar12].
                 super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var6 = psVar5[uVar12].
               super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      local_80 = uVar12;
      if ((local_c8 == (element_type *)0x0) ||
         (local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)
                   __dynamic_cast(local_c8,&ChElementBase::typeinfo,&ChElementTetrahedron::typeinfo,
                                  0xfffffffffffffffe),
         local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr == (element_type *)0x0)) {
        local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var6;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
            if (local_d8.
                super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr == (element_type *)0x0) goto LAB_006378e3;
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        uVar12 = 0;
        bVar7 = 0;
        local_e0 = p_Var6;
        do {
          (*(local_d8.
             super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->_vptr_ChElementHexahedron[2])
                    (&local_c0,
                     local_d8.
                     super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,uVar12);
          p_Var9 = (_Hash_node_base *)0x0;
          if ((local_68._M_buckets[(ulong)local_c0 % local_68._M_bucket_count] !=
               (__node_base_ptr)0x0) &&
             (p_Var10 = local_68._M_buckets[(ulong)local_c0 % local_68._M_bucket_count]->_M_nxt,
             p_Var9 = p_Var10, p_Var10[1]._M_nxt != local_c0)) {
            while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
              p_Var9 = (_Hash_node_base *)0x0;
              if (((ulong)p_Var10[1]._M_nxt % local_68._M_bucket_count !=
                   (ulong)local_c0 % local_68._M_bucket_count) ||
                 (p_Var9 = p_Var10, p_Var10[1]._M_nxt == local_c0)) goto LAB_00637813;
            }
            p_Var9 = (_Hash_node_base *)0x0;
          }
LAB_00637813:
          if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
          }
          bVar2 = (byte)(1 << ((uint)uVar12 & 0x1f));
          if (p_Var9 == (_Hash_node_base *)0x0) {
            bVar2 = 0;
          }
          uVar11 = (uint)uVar12 + 1;
          uVar12 = (ulong)uVar11;
          bVar7 = bVar7 | bVar2;
        } while (uVar11 != 4);
        iVar3 = 0;
        local_c0 = (_Hash_node_base *)((ulong)local_c0 & 0xffffffff00000000);
        do {
          if (((&DAT_00970809)[iVar3] & ~bVar7) == 0) {
            p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x30);
            p_Var6->_M_use_count = 1;
            p_Var6->_M_weak_count = 1;
            p_Var6->_vptr__Sp_counted_base = local_70;
            __gnu_cxx::new_allocator<chrono::fea::ChTetrahedronFace>::
            construct<chrono::fea::ChTetrahedronFace,std::shared_ptr<chrono::fea::ChElementTetrahedron>&,int&>
                      (&local_e1,(ChTetrahedronFace *)(p_Var6 + 1),
                       (shared_ptr<chrono::fea::ChElementTetrahedron> *)&local_d8,(int *)&local_c0);
            local_90 = (ChTetrahedronFace *)(p_Var6 + 1);
            local_88 = p_Var6;
            (*this->_vptr_ChMeshSurface[2])(this,&local_90);
            if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
            }
          }
          iVar1 = (int)local_c0;
          iVar3 = (int)local_c0 + 1;
          local_c0 = (_Hash_node_base *)CONCAT44(local_c0._4_4_,iVar3);
          p_Var6 = local_e0;
        } while (iVar1 < 3);
      }
LAB_006378e3:
      if (local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d8.
                   super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((local_c8 == (element_type *)0x0) ||
         (local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)
                   __dynamic_cast(local_c8,&ChElementBase::typeinfo,&ChElementHexahedron::typeinfo,
                                  0xfffffffffffffffe),
         (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          *)local_d8.
            super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         == (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)0x0)) {
        local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var6;
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
            if ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_d8.
                   super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr ==
                (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)0x0) goto LAB_00637ab1;
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        uVar11 = 0;
        bVar7 = 0;
        local_e0 = p_Var6;
        do {
          (*(code *)(local_d8.
                     super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_vptr_ChElementHexahedron[2])
                    (&local_c0,
                     local_d8.
                     super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,uVar11);
          p_Var9 = (_Hash_node_base *)0x0;
          if ((local_68._M_buckets[(ulong)local_c0 % local_68._M_bucket_count] !=
               (__node_base_ptr)0x0) &&
             (p_Var10 = local_68._M_buckets[(ulong)local_c0 % local_68._M_bucket_count]->_M_nxt,
             p_Var9 = p_Var10, p_Var10[1]._M_nxt != local_c0)) {
            while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
              p_Var9 = (_Hash_node_base *)0x0;
              if (((ulong)p_Var10[1]._M_nxt % local_68._M_bucket_count !=
                   (ulong)local_c0 % local_68._M_bucket_count) ||
                 (p_Var9 = p_Var10, p_Var10[1]._M_nxt == local_c0)) goto LAB_006379e1;
            }
            p_Var9 = (_Hash_node_base *)0x0;
          }
LAB_006379e1:
          if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
          }
          bVar2 = (byte)(1 << (uVar11 & 0x1f));
          if (p_Var9 == (_Hash_node_base *)0x0) {
            bVar2 = 0;
          }
          uVar11 = uVar11 + 1;
          bVar7 = bVar7 | bVar2;
        } while (uVar11 != 7);
        iVar3 = 0;
        local_c0 = (_Hash_node_base *)((ulong)local_c0 & 0xffffffff00000000);
        do {
          if (((&DAT_0097080d)[iVar3] & ~bVar7) == 0) {
            p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x30);
            p_Var6->_M_use_count = 1;
            p_Var6->_M_weak_count = 1;
            p_Var6->_vptr__Sp_counted_base = local_78;
            __gnu_cxx::new_allocator<chrono::fea::ChHexahedronFace>::
            construct<chrono::fea::ChHexahedronFace,std::shared_ptr<chrono::fea::ChElementHexahedron>&,int&>
                      ((new_allocator<chrono::fea::ChHexahedronFace> *)&local_e1,
                       (ChHexahedronFace *)(p_Var6 + 1),&local_d8,(int *)&local_c0);
            local_a0 = (ChHexahedronFace *)(p_Var6 + 1);
            local_98 = p_Var6;
            (*this->_vptr_ChMeshSurface[2])(this,&local_a0);
            if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
            }
          }
          iVar1 = (int)local_c0;
          iVar3 = (int)local_c0 + 1;
          local_c0 = (_Hash_node_base *)CONCAT44(local_c0._4_4_,iVar3);
          p_Var6 = local_e0;
        } while (iVar1 < 5);
      }
LAB_00637ab1:
      if (local_d8.super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d8.
                   super___shared_ptr<chrono::fea::ChElementHexahedron,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((local_c8 == (element_type *)0x0) ||
         (lVar8 = __dynamic_cast(local_c8,&ChElementBase::typeinfo,&ChLoadableUV::typeinfo,
                                 0xfffffffffffffffe), lVar8 == 0)) {
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00637b63;
      }
      else {
        if (p_Var6 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          local_a8 = p_Var6;
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
              goto LAB_00637b39;
            }
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
LAB_00637b39:
        local_b0 = lVar8;
        (*this->_vptr_ChMeshSurface[2])(this,&local_b0);
        if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
        }
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
LAB_00637b63:
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
      }
      psVar5 = (this->mmesh->velements).
               super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = local_80 + 1;
    } while (uVar12 < ((ulong)((long)(this->mmesh->velements).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5) >> 4
                      & 0xffffffff));
  }
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void ChMeshSurface::AddFacesFromNodeSet(std::vector<std::shared_ptr<ChNodeFEAbase> >& node_set) {
    std::unordered_set<size_t> node_set_map;
    for (int i = 0; i < node_set.size(); ++i)
        node_set_map.insert((size_t)node_set[i].get());

    for (unsigned int ie = 0; ie < this->mmesh->GetNelements(); ++ie) {
        auto element = mmesh->GetElement(ie);

        if (auto tet = std::dynamic_pointer_cast<ChElementTetrahedron>(element)) {
            unsigned char nodes = 0;  // if the i-th bit is 1, the corressponding hex node is in the set
            for (int in = 0; in < 4; in++) {
                if (node_set_map.find((size_t)tet->GetTetrahedronNode(in).get()) != node_set_map.end())
                    nodes |= 1 << in;
            }
            unsigned char masks[] = {
                0x0E,  // 1110 face 0
                0x0D,  // 1101 face 1
                0x0B,  // 1011 face 2
                0x07   // 0111 face 3
            };
            for (int j = 0; j < 4; j++) {
                if ((nodes & masks[j]) == masks[j])
                    AddFace(chrono_types::make_shared<ChTetrahedronFace>(tet, j));
            }
        }

        if (auto hex = std::dynamic_pointer_cast<ChElementHexahedron>(element)) {
            unsigned char nodes = 0;  // if the i-th bit is 1, the corressponding hex node is in the set
            for (int in = 0; in < 7; in++) {
                if (node_set_map.find((size_t)hex->GetHexahedronNode(in).get()) != node_set_map.end())
                    nodes |= 1 << in;
            }
            unsigned char masks[] = {
                0x0F,  // 00001111 face 0
                0x33,  // 00110011 face 1
                0x66,  // 01100110 face 2
                0xCC,  // 11001100 face 3
                0x99,  // 10011001 face 4
                0xF0   // 11110000 face 5
            };
            for (int j = 0; j < 6; j++) {
                if ((nodes & masks[j]) == masks[j])
                    AddFace(chrono_types::make_shared<ChHexahedronFace>(hex, j));
            }
        }

        if (auto shell = std::dynamic_pointer_cast<ChLoadableUV>(element)) {
            this->AddFace(shell);
        }
    }
}